

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  uint uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *unaff_R13;
  PathArgument *arg;
  pointer key;
  Value *pVVar4;
  
  key = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = root;
  if (key != (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_finish) {
    do {
      bVar2 = true;
      if (key->kind_ == kindKey) {
        if (root->field_0x8 == '\a') {
          root = Value::operator[](root,&key->key_);
          Value::nullSingleton();
          if (root == &Value::nullSingleton::nullStatic) {
            bVar2 = false;
            root = &Value::nullSingleton::nullStatic;
            unaff_R13 = Value::null;
          }
        }
        else {
LAB_005381ee:
          bVar2 = false;
          unaff_R13 = Value::null;
        }
      }
      else if (key->kind_ == kindIndex) {
        if ((root->field_0x8 != '\x06') ||
           (uVar1 = key->index_, AVar3 = Value::size(root), AVar3 <= uVar1)) goto LAB_005381ee;
        root = Value::operator[](root,key->index_);
      }
      pVVar4 = unaff_R13;
    } while ((bVar2) &&
            (key = key + 1, pVVar4 = root,
            key != (this->args_).
                   super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                   _M_impl.super__Vector_impl_data._M_finish));
  }
  return pVVar4;
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
        return Value::null;
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
        return Value::null;
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton()) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
        return Value::null;
      }
    }
  }
  return *node;
}